

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O2

parser_error parse_quest_name(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *v;
  
  pcVar1 = parser_getstr(p,"name");
  pvVar2 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x30);
  *v = pvVar2;
  parser_setpriv(p,v);
  pcVar1 = string_make(pcVar1);
  v[2] = pcVar1;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_quest_name(struct parser *p) {
	const char *name = parser_getstr(p, "name");
	struct quest *h = parser_priv(p);

	struct quest *q = mem_zalloc(sizeof(*q));
	q->next = h;
	parser_setpriv(p, q);
	q->name = string_make(name);

	return PARSE_ERROR_NONE;
}